

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_concat(lua_State *L,int n)

{
  long lVar1;
  int *piVar2;
  TValue *pTVar3;
  ulong uVar4;
  int in_ESI;
  long in_RDI;
  TValue *unaff_retaddr;
  lua_State *in_stack_00000008;
  TValue *top;
  int local_5c;
  undefined8 in_stack_fffffffffffffff8;
  
  if (in_ESI < 2) {
    if (in_ESI == 0) {
      piVar2 = *(int **)(in_RDI + 0x18);
      *piVar2 = *(int *)(in_RDI + 8) + 0x80;
      piVar2[1] = -5;
      uVar4 = *(long *)(in_RDI + 0x18) + 8;
      *(ulong *)(in_RDI + 0x18) = uVar4;
      if (*(uint *)(in_RDI + 0x20) <= uVar4) {
        lj_state_growstack1((lua_State *)0x112613);
      }
    }
  }
  else {
    local_5c = in_ESI + -1;
    do {
      pTVar3 = lj_meta_cat(in_stack_00000008,unaff_retaddr,
                           (int)((ulong)in_stack_fffffffffffffff8 >> 0x20));
      if (pTVar3 == (TValue *)0x0) {
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + (long)local_5c * -8;
        return;
      }
      lVar1 = *(long *)(in_RDI + 0x18);
      *(TValue **)(in_RDI + 0x18) = pTVar3 + 2;
      lj_vm_call(in_RDI,pTVar3,2);
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
      *(undefined8 *)(*(long *)(in_RDI + 0x18) + -8) = **(undefined8 **)(in_RDI + 0x18);
      local_5c = (local_5c - (int)(lVar1 - (long)pTVar3 >> 3)) + -1;
    } while (0 < local_5c);
  }
  return;
}

Assistant:

LUA_API void lua_concat(lua_State *L, int n)
{
  api_checknelems(L, n);
  if (n >= 2) {
    n--;
    do {
      TValue *top = lj_meta_cat(L, L->top-1, -n);
      if (top == NULL) {
	L->top -= n;
	break;
      }
      n -= (int)(L->top - top);
      L->top = top+2;
      lj_vm_call(L, top, 1+1);
      L->top--;
      copyTV(L, L->top-1, L->top);
    } while (--n > 0);
  } else if (n == 0) {  /* Push empty string. */
    setstrV(L, L->top, &G(L)->strempty);
    incr_top(L);
  }
  /* else n == 1: nothing to do. */
}